

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O0

void __thiscall CSocekt::flyd_wait_request_handler(CSocekt *this,lp_connection_t c)

{
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  LogLevel LVar1;
  LogStream *str;
  long in_RSI;
  long in_RDI;
  ssize_t reco;
  undefined4 in_stack_ffffffffffffafc8;
  uint in_stack_ffffffffffffafcc;
  Logger *in_stack_ffffffffffffafd0;
  Logger *pLVar2;
  char (*in_stack_ffffffffffffafd8) [108];
  SourceFile *in_stack_ffffffffffffafe0;
  lp_connection_t in_stack_ffffffffffffaff8;
  CSocekt *in_stack_ffffffffffffb000;
  lp_connection_t in_stack_ffffffffffffb068;
  CSocekt *in_stack_ffffffffffffb070;
  Logger local_3fb8;
  Logger local_2fd0;
  Logger local_1fe8;
  ulong local_1010;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  lp_connection_t in_stack_ffffffffffffffe0;
  CSocekt *in_stack_ffffffffffffffe8;
  
  LVar1 = muduo::Logger::logLevel();
  if ((int)LVar1 < 3) {
    muduo::Logger::SourceFile::SourceFile<108>(in_stack_ffffffffffffafe0,in_stack_ffffffffffffafd8);
    file._8_8_ = in_stack_ffffffffffffafe0;
    file.data_ = *in_stack_ffffffffffffafd8;
    muduo::Logger::Logger(in_stack_ffffffffffffafd0,file,in_stack_ffffffffffffafcc);
    muduo::Logger::stream((Logger *)&stack0xfffffffffffff018);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffafe0,*in_stack_ffffffffffffafd8);
    muduo::Logger::~Logger((Logger *)in_stack_ffffffffffffb000);
  }
  local_1010 = recvproc(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                        in_stack_ffffffffffffffd8,(ssize_t)in_stack_ffffffffffffffd0);
  LVar1 = muduo::Logger::logLevel();
  if ((int)LVar1 < 3) {
    muduo::Logger::SourceFile::SourceFile<108>(in_stack_ffffffffffffafe0,in_stack_ffffffffffffafd8);
    file_00._8_8_ = in_stack_ffffffffffffafe0;
    file_00.data_ = *in_stack_ffffffffffffafd8;
    muduo::Logger::Logger(in_stack_ffffffffffffafd0,file_00,in_stack_ffffffffffffafcc);
    muduo::Logger::stream(&local_1fe8);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffafe0,*in_stack_ffffffffffffafd8);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffafd0,in_stack_ffffffffffffafcc);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffafe0,*in_stack_ffffffffffffafd8);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffafe0,*in_stack_ffffffffffffafd8);
    in_stack_ffffffffffffb000 =
         (CSocekt *)
         muduo::LogStream::operator<<
                   ((LogStream *)in_stack_ffffffffffffafd0,
                    CONCAT44(in_stack_ffffffffffffafcc,in_stack_ffffffffffffafc8));
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffafe0,*in_stack_ffffffffffffafd8);
    muduo::Logger::~Logger((Logger *)in_stack_ffffffffffffb000);
  }
  if (0 < (long)local_1010) {
    if (*(char *)(in_RSI + 0x6c) == '\0') {
      if (local_1010 == *(ulong *)(in_RDI + 8)) {
        LVar1 = muduo::Logger::logLevel();
        if ((int)LVar1 < 3) {
          muduo::Logger::SourceFile::SourceFile<108>
                    (in_stack_ffffffffffffafe0,in_stack_ffffffffffffafd8);
          file_01._8_8_ = in_stack_ffffffffffffafe0;
          file_01.data_ = *in_stack_ffffffffffffafd8;
          muduo::Logger::Logger(in_stack_ffffffffffffafd0,file_01,in_stack_ffffffffffffafcc);
          in_stack_ffffffffffffaff8 = (lp_connection_t)muduo::Logger::stream(&local_2fd0);
          muduo::LogStream::operator<<
                    ((LogStream *)in_stack_ffffffffffffafe0,*in_stack_ffffffffffffafd8);
          muduo::Logger::~Logger((Logger *)in_stack_ffffffffffffb000);
        }
        flyd_wait_request_handler_proc_p1(in_stack_ffffffffffffb000,in_stack_ffffffffffffaff8);
      }
      else {
        LVar1 = muduo::Logger::logLevel();
        if ((int)LVar1 < 3) {
          muduo::Logger::SourceFile::SourceFile<108>
                    (in_stack_ffffffffffffafe0,in_stack_ffffffffffffafd8);
          pLVar2 = &local_3fb8;
          file_02._8_8_ = pLVar2;
          file_02.data_ = *in_stack_ffffffffffffafd8;
          muduo::Logger::Logger(in_stack_ffffffffffffafd0,file_02,in_stack_ffffffffffffafcc);
          muduo::Logger::stream(pLVar2);
          muduo::LogStream::operator<<((LogStream *)pLVar2,*in_stack_ffffffffffffafd8);
          muduo::Logger::~Logger((Logger *)in_stack_ffffffffffffb000);
        }
        *(undefined1 *)(in_RSI + 0x6c) = 1;
        *(ulong *)(in_RSI + 0x88) = *(long *)(in_RSI + 0x88) + local_1010;
        *(int *)(in_RSI + 0x90) = *(int *)(in_RSI + 0x90) - (int)local_1010;
      }
    }
    else if (*(char *)(in_RSI + 0x6c) == '\x01') {
      LVar1 = muduo::Logger::logLevel();
      if ((int)LVar1 < 3) {
        muduo::Logger::SourceFile::SourceFile<108>
                  (in_stack_ffffffffffffafe0,in_stack_ffffffffffffafd8);
        pLVar2 = (Logger *)&stack0xffffffffffffb060;
        file_03._8_8_ = in_stack_ffffffffffffafe0;
        file_03.data_ = *in_stack_ffffffffffffafd8;
        muduo::Logger::Logger(pLVar2,file_03,in_stack_ffffffffffffafcc);
        str = muduo::Logger::stream(pLVar2);
        muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffafe0,(char *)str);
        muduo::Logger::~Logger((Logger *)in_stack_ffffffffffffb000);
      }
      if (*(uint *)(in_RSI + 0x90) == local_1010) {
        flyd_wait_request_handler_proc_p1(in_stack_ffffffffffffb000,in_stack_ffffffffffffaff8);
      }
      else {
        *(undefined1 *)(in_RSI + 0x6c) = 1;
        *(ulong *)(in_RSI + 0x88) = *(long *)(in_RSI + 0x88) + local_1010;
        *(int *)(in_RSI + 0x90) = *(int *)(in_RSI + 0x90) - (int)local_1010;
      }
    }
    else if (*(char *)(in_RSI + 0x6c) == '\x02') {
      if (local_1010 == *(uint *)(in_RSI + 0x90)) {
        flyd_wait_request_handler_proc_plast(in_stack_ffffffffffffb070,in_stack_ffffffffffffb068);
      }
      else {
        *(undefined1 *)(in_RSI + 0x6c) = 3;
        *(ulong *)(in_RSI + 0x88) = *(long *)(in_RSI + 0x88) + local_1010;
        *(int *)(in_RSI + 0x90) = *(int *)(in_RSI + 0x90) - (int)local_1010;
      }
    }
    else if (*(char *)(in_RSI + 0x6c) == '\x03') {
      if (*(uint *)(in_RSI + 0x90) == local_1010) {
        flyd_wait_request_handler_proc_plast(in_stack_ffffffffffffb070,in_stack_ffffffffffffb068);
      }
      else {
        *(ulong *)(in_RSI + 0x88) = *(long *)(in_RSI + 0x88) + local_1010;
        *(int *)(in_RSI + 0x90) = *(int *)(in_RSI + 0x90) - (int)local_1010;
      }
    }
  }
  return;
}

Assistant:

void CSocekt::flyd_wait_request_handler(lp_connection_t c)
{
    LOG_INFO << "调用了flyd_wait_request_handler函数";
    //收包，注意我们用的第二个和第三个参数，我们用的始终是这两个参数，因此我们必须保证 c->precvbuf指向正确的收包位置，保证c->irecvlen指向正确的收包宽度
    
    ssize_t reco = recvproc(c,c->precvbuf,c->irecvlen);
    LOG_INFO << "要接收" << c->irecvlen << "字节" << "收到" << reco << "字节";
    if(reco <= 0)
    {
        return;//该处理的上边这个recvproc()函数处理过了，这里<=0是直接return
    }

    //走到这里，说明成功收到了一些字节（>0），就要开始判断收到了多少数据了
    if(c->curStat == _PKG_HD_INIT) //连接建立起来时肯定是这个状态，因为在ngx_get_connection()中已经把curStat成员赋值成_PKG_HD_INIT了
    {
        if(reco == m_iLenPkgHeader)//正好收到完整包头，这里拆解包头
        {
            LOG_INFO << "完整的包头";
            flyd_wait_request_handler_proc_p1(c); //那就调用专门针对包头处理完整的函数去处理把。
        }
        else
        {
             LOG_INFO << "包头不完整";
            //收到的包头不完整--我们不能预料每个包的长度，也不能预料各种拆包/粘包情况，所以收到不完整包头【也算是缺包】是很可能的；
            c->curStat        = _PKG_HD_RECVING;                 //接收包头中，包头不完整，继续接收包头中
            c->precvbuf       = c->precvbuf + reco;              //注意收后续包的内存往后走
            c->irecvlen       = c->irecvlen - reco;              //要收的内容当然要减少，以确保只收到完整的包头先
        } //end  if(reco == m_iLenPkgHeader)
    }
    else if(c->curStat == _PKG_HD_RECVING) //接收包头中，包头不完整，继续接收中，这个条件才会成立
    {
        LOG_INFO << "接收包头中...";
        if(c->irecvlen == reco) //要求收到的宽度和我实际收到的宽度相等
        {
            //包头收完整了
            flyd_wait_request_handler_proc_p1(c); //那就调用专门针对包头处理完整的函数去处理把。
        }
        else
        {
            //包头还是没收完整，继续收包头
            c->curStat        = _PKG_HD_RECVING;                 //没必要
            c->precvbuf       = c->precvbuf + reco;              //注意收后续包的内存往后走
            c->irecvlen       = c->irecvlen - reco;              //要收的内容当然要减少，以确保只收到完整的包头先
        }
    }
    else if(c->curStat == _PKG_BD_INIT)
    {
        //包头刚好收完，准备接收包体
        if(reco == c->irecvlen)
        {
            //收到的宽度等于要收的宽度，包体也收完整了
            flyd_wait_request_handler_proc_plast(c);
        }
        else
        {
            //收到的宽度小于要收的宽度
            c->curStat = _PKG_BD_RECVING;
            c->precvbuf = c->precvbuf + reco;
            c->irecvlen = c->irecvlen - reco;
        }
    }
    else if(c->curStat == _PKG_BD_RECVING)
    {
        //接收包体中，包体不完整，继续接收中
        if(c->irecvlen == reco)
        {
            //包体收完整了
            flyd_wait_request_handler_proc_plast(c);
        }
        else
        {
            //包体没收完整，继续收
            c->precvbuf = c->precvbuf + reco;
            c->irecvlen = c->irecvlen - reco;
        }
    }  //end if(c->curStat == _PKG_HD_INIT)

}